

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::AddTranslationPath(string *a,string *b)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  bool bVar1;
  __type _Var2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  undefined1 local_58 [8];
  string path_b;
  string path_a;
  string *b_local;
  string *a_local;
  
  std::__cxx11::string::string((string *)(path_b.field_2._M_local_buf + 8),(string *)a);
  std::__cxx11::string::string((string *)local_58,(string *)b);
  ConvertToUnixSlashes((string *)((long)&path_b.field_2 + 8));
  ConvertToUnixSlashes((string *)local_58);
  bVar1 = FileIsDirectory((string *)((long)&path_b.field_2 + 8));
  if (((bVar1) && (bVar1 = FileIsFullPath((string *)local_58), bVar1)) &&
     (lVar3 = std::__cxx11::string::find(local_58,0x1043816), lVar3 == -1)) {
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) && (pcVar5 = (char *)std::__cxx11::string::back(), *pcVar5 != '/')) {
      std::__cxx11::string::operator+=((string *)(path_b.field_2._M_local_buf + 8),'/');
    }
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) && (pcVar5 = (char *)std::__cxx11::string::back(), *pcVar5 != '/')) {
      std::__cxx11::string::operator+=((string *)local_58,'/');
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&path_b.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58);
    this = SystemToolsStatics;
    if (!_Var2) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&path_b.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::insert(this,&local_a8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_a8);
    }
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(path_b.field_2._M_local_buf + 8));
  return;
}

Assistant:

void SystemTools::AddTranslationPath(const std::string& a,
                                     const std::string& b)
{
  std::string path_a = a;
  std::string path_b = b;
  SystemTools::ConvertToUnixSlashes(path_a);
  SystemTools::ConvertToUnixSlashes(path_b);
  // First check this is a directory path, since we don't want the table to
  // grow too fat
  if (SystemTools::FileIsDirectory(path_a)) {
    // Make sure the path is a full path and does not contain no '..'
    // Ken--the following code is incorrect. .. can be in a valid path
    // for example  /home/martink/MyHubba...Hubba/Src
    if (SystemTools::FileIsFullPath(path_b) &&
        path_b.find("..") == std::string::npos) {
      // Before inserting make sure path ends with '/'
      if (!path_a.empty() && path_a.back() != '/') {
        path_a += '/';
      }
      if (!path_b.empty() && path_b.back() != '/') {
        path_b += '/';
      }
      if (!(path_a == path_b)) {
        SystemToolsStatics->TranslationMap.insert(
          SystemToolsStatic::StringMap::value_type(std::move(path_a),
                                                   std::move(path_b)));
      }
    }
  }
}